

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O3

void NJDNode_set_cform(NJDNode *node,char *str)

{
  char *pcVar1;
  
  if (node->cform != (char *)0x0) {
    free(node->cform);
  }
  if ((str == (char *)0x0) || (*str == '\0')) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = strdup(str);
  }
  node->cform = pcVar1;
  return;
}

Assistant:

void NJDNode_set_cform(NJDNode * node, const char *str)
{
   if (node->cform != NULL)
      free(node->cform);
   if (str == NULL || strlen(str) == 0)
      node->cform = NULL;
   else
      node->cform = strdup(str);
}